

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprIdxCover(Walker *pWalker,Expr *pExpr)

{
  i16 iVar1;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  if (((pExpr->op == 0xa7) && (pExpr->iTable == ((pWalker->u).pIdxCover)->iCur)) &&
     (iVar1 = sqlite3TableColumnToIndex(((pWalker->u).pIdxCover)->pIdx,pExpr->iColumn), iVar1 < 0))
  {
    pWalker->eCode = 1;
    return 2;
  }
  return 0;
}

Assistant:

static int exprIdxCover(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pWalker->u.pIdxCover->iCur
   && sqlite3TableColumnToIndex(pWalker->u.pIdxCover->pIdx, pExpr->iColumn)<0
  ){
    pWalker->eCode = 1;
    return WRC_Abort;
  }
  return WRC_Continue;
}